

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O2

int run_slave_process(Options *opts,Options *replayer_opts,
                     vector<const_char_*,_std::allocator<const_char_*>_> *databases)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  ulonglong hash;
  char ignored_shader_module_hash [18];
  sigset_t mask;
  sigset_t old_mask;
  Options tmp_opts;
  ThreadedReplayer replayer;
  
  alt_stack.ss_flags = 0;
  alt_stack._12_4_ = 0;
  alt_stack.ss_sp = malloc(0x100000);
  alt_stack.ss_size = 0x100000;
  alt_stack._8_8_ = alt_stack._8_8_ & 0xffffffff00000000;
  iVar1 = sigaltstack((sigaltstack *)&alt_stack,(sigaltstack *)0x0);
  if (iVar1 < 0) {
    return 1;
  }
  ThreadedReplayer::Options::Options(&tmp_opts,replayer_opts);
  tmp_opts.on_thread_callback = thread_callback;
  tmp_opts.on_validation_error_callback = validation_error_cb;
  ThreadedReplayer::ThreadedReplayer(&replayer,opts,&tmp_opts);
  replayer.robustness = true;
  while (pcVar3 = fgets(ignored_shader_module_hash,0x12,_stdin), pcVar3 != (char *)0x0) {
    piVar4 = __errno_location();
    *piVar4 = 0;
    hash = strtoull(ignored_shader_module_hash,(char **)0x0,0x10);
    if (hash == 0) break;
    if (*piVar4 == 0) {
      ThreadedReplayer::mask_shader_module(&replayer,hash);
    }
  }
  iVar1 = 1;
  crash_fd = dup(1);
  close(1);
  global_replayer = &replayer;
  if (replayer_opts->disable_signal_handler == false) {
    memset((sigaction *)&mask,0,0x98);
    sigemptyset((sigset_t *)(mask.__val + 1));
    mask.__val[0] = (unsigned_long)crash_handler;
    iVar2 = sigaction(0xb,(sigaction *)&mask,(sigaction *)0x0);
    if ((((iVar2 < 0) || (iVar2 = sigaction(8,(sigaction *)&mask,(sigaction *)0x0), iVar2 < 0)) ||
        (iVar2 = sigaction(4,(sigaction *)&mask,(sigaction *)0x0), iVar2 < 0)) ||
       ((iVar2 = sigaction(7,(sigaction *)&mask,(sigaction *)0x0), iVar2 < 0 ||
        (iVar2 = sigaction(6,(sigaction *)&mask,(sigaction *)0x0), iVar2 < 0)))) goto LAB_00125105;
  }
  sigemptyset((sigset_t *)&mask);
  sigaddset((sigset_t *)&mask,6);
  iVar1 = pthread_sigmask(0,(sigset_t *)&mask,(__sigset_t *)&old_mask);
  if (iVar1 < 0) {
    iVar1 = 1;
  }
  else {
    iVar1 = run_normal_process(&replayer,databases,(char *)0x0,0,(long)Global::metadata_fd);
    global_replayer = (ThreadedReplayer *)0x0;
    if (replayer_opts->disable_signal_handler == false) {
      signal(0xb,(__sighandler_t)0x0);
      signal(8,(__sighandler_t)0x0);
      signal(4,(__sighandler_t)0x0);
      signal(7,(__sighandler_t)0x0);
      signal(6,(__sighandler_t)0x0);
    }
    pthread_sigmask(2,(__sigset_t *)&old_mask,(__sigset_t *)0x0);
    free(alt_stack.ss_sp);
  }
LAB_00125105:
  ThreadedReplayer::~ThreadedReplayer(&replayer);
  ThreadedReplayer::Options::~Options(&tmp_opts);
  return iVar1;
}

Assistant:

static int run_slave_process(const VulkanDevice::Options &opts,
                             const ThreadedReplayer::Options &replayer_opts,
                             const vector<const char *> &databases)
{
	// Just in case the driver crashed due to stack overflow,
	// provide an alternate stack where we can clean up "safely".
	alt_stack = {};
	alt_stack.ss_sp = malloc(1024 * 1024);
	alt_stack.ss_size = 1024 * 1024;
	alt_stack.ss_flags = 0;
	if (sigaltstack(&alt_stack, nullptr) < 0)
		return EXIT_FAILURE;

	auto tmp_opts = replayer_opts;
	tmp_opts.on_thread_callback = thread_callback;
	tmp_opts.on_validation_error_callback = validation_error_cb;
	ThreadedReplayer replayer(opts, tmp_opts);
	replayer.robustness = true;

	// In slave mode, we can receive a list of shader module hashes we should ignore.
	// This is to avoid trying to replay the same faulty shader modules again and again.
	char ignored_shader_module_hash[16 + 2];
	while (fgets(ignored_shader_module_hash, sizeof(ignored_shader_module_hash), stdin))
	{
		errno = 0;
		auto hash = strtoull(ignored_shader_module_hash, nullptr, 16);
		if (hash == 0)
			break;
		if (errno == 0)
		{
			//LOGE("Ignoring module %llx\n", hash);
			replayer.mask_shader_module(Hash(hash));
		}
	}

	// Make sure that the driver cannot mess up the master process by writing random data to stdout.
	crash_fd = dup(STDOUT_FILENO);
	close(STDOUT_FILENO);

	global_replayer = &replayer;

	if (!replayer_opts.disable_signal_handler)
	{
		// Install the signal handlers.
		// It's very important that this runs in a single thread,
		// so we cannot have some rogue thread overriding these handlers.
		struct sigaction act;
		memset(&act, 0, sizeof(act));
		sigemptyset(&act.sa_mask);
		act.sa_handler = crash_handler;
		act.sa_flags = SA_RESETHAND | SA_ONSTACK;

		if (sigaction(SIGSEGV, &act, nullptr) < 0)
			return EXIT_FAILURE;
		if (sigaction(SIGFPE, &act, nullptr) < 0)
			return EXIT_FAILURE;
		if (sigaction(SIGILL, &act, nullptr) < 0)
			return EXIT_FAILURE;
		if (sigaction(SIGBUS, &act, nullptr) < 0)
			return EXIT_FAILURE;
		if (sigaction(SIGABRT, &act, nullptr) < 0)
			return EXIT_FAILURE;
	}

	// Don't allow the main thread to handle abort signals.
	sigset_t mask;
	sigemptyset(&mask);
	sigaddset(&mask, SIGABRT);
	sigset_t old_mask;
	if (pthread_sigmask(SIG_BLOCK, &mask, &old_mask) < 0)
		return EXIT_FAILURE;

	int ret = run_normal_process(replayer, databases, nullptr, 0, Global::metadata_fd);
	global_replayer = nullptr;

	if (!replayer_opts.disable_signal_handler)
	{
		// Cannot reliably handle these signals if they occur during teardown of the process.
		signal(SIGSEGV, SIG_DFL);
		signal(SIGFPE, SIG_DFL);
		signal(SIGILL, SIG_DFL);
		signal(SIGBUS, SIG_DFL);
		signal(SIGABRT, SIG_DFL);
	}
	pthread_sigmask(SIG_SETMASK, &old_mask, nullptr);

	free(alt_stack.ss_sp);

#if 0
	if (Global::control_block)
	{
		futex_wrapper_lock(&Global::control_block->futex_lock);
		char msg[ControlBlockMessageSize] = {};
		sprintf(msg, "SLAVE_FINISHED\n");
		shared_control_block_write(Global::control_block, msg, sizeof(msg));
		futex_wrapper_unlock(&Global::control_block->futex_lock);
	}
#endif

	return ret;
}